

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O3

ExportedNames * __thiscall
Js::SourceTextModuleRecord::GetExportedNames
          (SourceTextModuleRecord *this,ExportModuleRecordList *exportStarSet)

{
  Type *addr;
  RealCount *pRVar1;
  IdentPtr pIVar2;
  code *pcVar3;
  SourceTextModuleRecord *pSVar4;
  bool bVar5;
  int iVar6;
  Type pSVar7;
  ExportedNames *pEVar8;
  undefined4 *puVar9;
  Type *pTVar10;
  ExportModuleRecordList *this_00;
  SourceTextModuleRecord *pSVar11;
  Type *pTVar12;
  ArenaAllocator *alloc;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *pSVar13;
  Iterator local_68;
  Type *local_58;
  SourceTextModuleRecord *local_50;
  SourceTextModuleRecord *local_48;
  SourceTextModuleRecord *moduleRecord;
  SourceTextModuleRecord *local_38;
  undefined4 extraout_var;
  
  if (exportStarSet == (ExportModuleRecordList *)0x0) {
    pEVar8 = (this->exportedNames).ptr;
    if (pEVar8 != (ExportedNames *)0x0) {
      return pEVar8;
    }
    local_58 = &this->scriptContext;
    alloc = &((this->scriptContext).ptr)->generalAllocator;
    this_00 = (ExportModuleRecordList *)new<Memory::ArenaAllocator>(0x18,alloc,0x364470);
    (this_00->super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this_00;
    (this_00->super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>).
    super_RealCount.count = 0;
    this_00->allocator = alloc;
  }
  else {
    local_58 = &this->scriptContext;
    alloc = &((this->scriptContext).ptr)->generalAllocator;
    this_00 = exportStarSet;
  }
  bVar5 = SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>::Has
                    (&this_00->
                      super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>,
                     &this->super_ModuleRecordBase);
  if (bVar5) {
    return (ExportedNames *)0x0;
  }
  pSVar7 = (Type)new<Memory::ArenaAllocator>(0x10,this_00->allocator,0x364470);
  pSVar7[1].next = (Type)this;
  pSVar7->next = (this_00->
                 super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>).
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (this_00->super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar7;
  pRVar1 = &(this_00->super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>).
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  local_50 = this;
  if ((this->localExportRecordList).ptr ==
      (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    if ((this->indirectExportRecordList).ptr ==
        (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      if ((this->starExportRecordList).ptr !=
          (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        pEVar8 = (ExportedNames *)new<Memory::ArenaAllocator>(0x18,alloc,0x364470);
        (pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pEVar8;
        (pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count = 0;
        pEVar8->allocator = alloc;
        pSVar13 = (this->starExportRecordList).ptr;
        goto LAB_00b048b4;
      }
      pEVar8 = (ExportedNames *)0x0;
      goto LAB_00b04bd1;
    }
    pEVar8 = (ExportedNames *)new<Memory::ArenaAllocator>(0x18,alloc,0x364470);
    (pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pEVar8;
    (pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count = 0;
    pEVar8->allocator = alloc;
    pSVar11 = (SourceTextModuleRecord *)(this->indirectExportRecordList).ptr;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pSVar4 = pSVar11;
LAB_00b047e6:
    while( true ) {
      local_38 = pSVar4;
      moduleRecord = pSVar11;
      if (local_38 == (SourceTextModuleRecord *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_00b04c0c;
        *puVar9 = 0;
      }
      pSVar11 = (SourceTextModuleRecord *)
                ((SListNodeBase<Memory::ArenaAllocator> *)
                &(local_38->super_ModuleRecordBase).super_FinalizableObject)->next;
      if (pSVar11 == moduleRecord) break;
      local_38 = pSVar11;
      pTVar10 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
                Data((Iterator *)&moduleRecord);
      pIVar2 = pTVar10->exportName;
      iVar6 = pIVar2->m_propertyId;
      if (iVar6 == -1) {
        iVar6 = ScriptContext::GetOrAddPropertyIdTracked
                          (local_58->ptr,(LPCWSTR)&pIVar2->field_0x22,pIVar2->m_cch);
        pIVar2->m_propertyId = iVar6;
      }
      pSVar7 = (Type)new<Memory::ArenaAllocator>(0x10,pEVar8->allocator,0x364470);
      *(int *)&pSVar7[1].next = iVar6;
      pSVar7->next = (pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
      (pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar7;
      pRVar1 = &(pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      pSVar11 = moduleRecord;
      pSVar4 = local_38;
    }
  }
  else {
    pEVar8 = (ExportedNames *)new<Memory::ArenaAllocator>(0x18,alloc,0x364470);
    (pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pEVar8;
    (pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count = 0;
    pEVar8->allocator = alloc;
    pSVar11 = (SourceTextModuleRecord *)(this->localExportRecordList).ptr;
    moduleRecord = pSVar11;
    local_38 = pSVar11;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      if (pSVar11 == (SourceTextModuleRecord *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_00b04c0c;
        *puVar9 = 0;
        pSVar11 = local_38;
      }
      pSVar11 = (SourceTextModuleRecord *)
                ((SListNodeBase<Memory::ArenaAllocator> *)
                &(pSVar11->super_ModuleRecordBase).super_FinalizableObject)->next;
      if (pSVar11 == moduleRecord) break;
      local_38 = pSVar11;
      pTVar10 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
                Data((Iterator *)&moduleRecord);
      pIVar2 = pTVar10->exportName;
      iVar6 = pIVar2->m_propertyId;
      if (iVar6 == -1) {
        iVar6 = ScriptContext::GetOrAddPropertyIdTracked
                          (local_58->ptr,(LPCWSTR)&pIVar2->field_0x22,pIVar2->m_cch);
        pIVar2->m_propertyId = iVar6;
      }
      pSVar7 = (Type)new<Memory::ArenaAllocator>(0x10,pEVar8->allocator,0x364470);
      *(int *)&pSVar7[1].next = iVar6;
      pSVar7->next = (pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
      (pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar7;
      pRVar1 = &(pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      pSVar11 = local_38;
    }
    pSVar11 = (SourceTextModuleRecord *)(local_50->indirectExportRecordList).ptr;
    pSVar4 = pSVar11;
    if (pSVar11 != (SourceTextModuleRecord *)0x0) goto LAB_00b047e6;
  }
  pSVar13 = (local_50->starExportRecordList).ptr;
  if (pSVar13 != (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
LAB_00b048b4:
    local_68.list =
         &pSVar13->super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>;
    local_68.current = (NodeBase *)pSVar13;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (pSVar13 == (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) {
LAB_00b04c0c:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
        pSVar13 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                  local_68.current;
      }
      pSVar13 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                (pSVar13->
                super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>).
                super_SListNodeBase<Memory::ArenaAllocator>.next;
      if (pSVar13 ==
          (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)local_68.list)
      break;
      local_68.current = (NodeBase *)pSVar13;
      pTVar10 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
                Data(&local_68);
      pIVar2 = pTVar10->moduleRequest;
      if (pIVar2 == (IdentPtr)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                    ,0x1fe,"(exportEntry.moduleRequest != nullptr)",
                                    "exportEntry.moduleRequest != nullptr");
        if (!bVar5) goto LAB_00b04c0c;
        *puVar9 = 0;
      }
      local_48 = (SourceTextModuleRecord *)0x0;
      moduleRecord = (SourceTextModuleRecord *)&pIVar2->field_0x22;
      bVar5 = JsUtil::
              BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<char16_t_const*>
                        ((BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(local_50->childrenModuleSet).ptr,(char16_t **)&moduleRecord,&local_48);
      if (bVar5) {
        if (local_48->wasParsed == false) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                      ,0x202,"(moduleRecord->WasParsed())",
                                      "moduleRecord->WasParsed()");
          if (!bVar5) goto LAB_00b04c0c;
          *puVar9 = 0;
        }
        if (local_48->wasDeclarationInitialized == false) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                      ,0x203,"(moduleRecord->WasDeclarationInitialized())",
                                      "moduleRecord->WasDeclarationInitialized()");
          if (!bVar5) goto LAB_00b04c0c;
          *puVar9 = 0;
        }
        if ((local_48->super_ModuleRecordBase).wasEvaluated == true) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                      ,0x204,"(!moduleRecord->WasEvaluated())",
                                      "!moduleRecord->WasEvaluated()");
          if (!bVar5) goto LAB_00b04c0c;
          *puVar9 = 0;
        }
        iVar6 = (*(local_48->super_ModuleRecordBase).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[8])(local_48,this_00);
        pSVar11 = (SourceTextModuleRecord *)CONCAT44(extraout_var,iVar6);
        pSVar13 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                  local_68.current;
        pSVar4 = pSVar11;
        if (pSVar11 != (SourceTextModuleRecord *)0x0) {
          while( true ) {
            local_38 = pSVar4;
            moduleRecord = pSVar11;
            if (local_38 == (SourceTextModuleRecord *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar9 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                          ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar5) goto LAB_00b04c0c;
              *puVar9 = 0;
            }
            pSVar11 = (SourceTextModuleRecord *)
                      ((SListNodeBase<Memory::ArenaAllocator> *)
                      &(local_38->super_ModuleRecordBase).super_FinalizableObject)->next;
            pSVar13 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                      local_68.current;
            if (pSVar11 == moduleRecord) break;
            local_38 = pSVar11;
            pTVar12 = SListBase<int,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                ((Iterator *)&moduleRecord);
            iVar6 = *pTVar12;
            pSVar11 = moduleRecord;
            pSVar4 = local_38;
            if ((iVar6 != 0x6e) &&
               (bVar5 = SListBase<int,_Memory::ArenaAllocator,_RealCount>::Has
                                  (&pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>,
                                   iVar6), pSVar11 = moduleRecord, pSVar4 = local_38, !bVar5)) {
              pSVar7 = (Type)new<Memory::ArenaAllocator>(0x10,pEVar8->allocator,0x364470);
              *(int *)&pSVar7[1].next = iVar6;
              pSVar7->next = (pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
                             super_SListNodeBase<Memory::ArenaAllocator>.next;
              (pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
              super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar7;
              pRVar1 = &(pEVar8->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
                        super_RealCount;
              pRVar1->count = pRVar1->count + 1;
              pSVar11 = moduleRecord;
              pSVar4 = local_38;
            }
          }
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                    ,0x214,"(false)",
                                    "dependent modules should have been initialized");
        if (!bVar5) goto LAB_00b04c0c;
        *puVar9 = 0;
        pSVar13 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                  local_68.current;
      }
    } while( true );
  }
LAB_00b04bd1:
  pSVar11 = local_50;
  if (exportStarSet == (ExportModuleRecordList *)0x0) {
    addr = &local_50->exportedNames;
    Memory::Recycler::WBSetBit((char *)addr);
    (pSVar11->exportedNames).ptr = pEVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  return pEVar8;
}

Assistant:

ExportedNames* SourceTextModuleRecord::GetExportedNames(ExportModuleRecordList* exportStarSet)
    {
        const bool isRootGetExportedNames = (exportStarSet == nullptr);

        // this->exportedNames only caches root "GetExportedNames(nullptr)"
        if (isRootGetExportedNames && exportedNames != nullptr)
        {
            return exportedNames;
        }

        ArenaAllocator* allocator = scriptContext->GeneralAllocator();

        if (exportStarSet == nullptr)
        {
            exportStarSet = Anew(allocator, ExportModuleRecordList, allocator);
        }
        if (exportStarSet->Has(this))
        {
            return nullptr;
        }
        exportStarSet->Prepend(this);

        ExportedNames* tempExportedNames = nullptr;
        if (this->localExportRecordList != nullptr)
        {
            tempExportedNames = Anew(allocator, ExportedNames, allocator);
            this->localExportRecordList->Map([=](ModuleImportOrExportEntry exportEntry) {
                PropertyId exportNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                tempExportedNames->Prepend(exportNameId);
            });
        }
        if (this->indirectExportRecordList != nullptr)
        {
            if (tempExportedNames == nullptr)
            {
                tempExportedNames = Anew(allocator, ExportedNames, allocator);
            }
            this->indirectExportRecordList->Map([=](ModuleImportOrExportEntry exportEntry) {
                PropertyId exportedNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                tempExportedNames->Prepend(exportedNameId);
            });
        }
        if (this->starExportRecordList != nullptr)
        {
            if (tempExportedNames == nullptr)
            {
                tempExportedNames = Anew(allocator, ExportedNames, allocator);
            }
            this->starExportRecordList->Map([=](ModuleImportOrExportEntry exportEntry) {
                Assert(exportEntry.moduleRequest != nullptr);
                SourceTextModuleRecord* moduleRecord = nullptr;
                if (this->childrenModuleSet->TryGetValue(exportEntry.moduleRequest->Psz(), &moduleRecord))
                {
                    Assert(moduleRecord->WasParsed());
                    Assert(moduleRecord->WasDeclarationInitialized()); // we should be half way during initialization
                    Assert(!moduleRecord->WasEvaluated());
                    ExportedNames* starExportedNames = moduleRecord->GetExportedNames(exportStarSet);
                    // We are not rejecting ambiguous resolution at this time.
                    if (starExportedNames != nullptr)
                    {
                        starExportedNames->Map([&](PropertyId propertyId) {
                            if (propertyId != PropertyIds::default_ && !tempExportedNames->Has(propertyId))
                            {
                                tempExportedNames->Prepend(propertyId);
                            }
                        });
                    }
                }
#if DBG
                else
                {
                    AssertMsg(false, "dependent modules should have been initialized");
                }
#endif
            });
        }

        // this->exportedNames only caches root "GetExportedNames(nullptr)"
        if (isRootGetExportedNames)
        {
            exportedNames = tempExportedNames;
        }

        return tempExportedNames;
    }